

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

mg_date * mg_date_copy_ca(mg_date *src,mg_allocator *allocator)

{
  mg_date *pmVar1;
  
  if (src != (mg_date *)0x0) {
    pmVar1 = (mg_date *)mg_allocator_malloc(allocator,8);
    if (pmVar1 == (mg_date *)0x0) {
      pmVar1 = (mg_date *)0x0;
    }
    else {
      pmVar1->days = src->days;
    }
    return pmVar1;
  }
  return (mg_date *)0x0;
}

Assistant:

mg_date *mg_date_copy_ca(const mg_date *src, mg_allocator *allocator) {
  if (!src) {
    return NULL;
  }
  mg_date *date = mg_date_alloc(allocator);
  if (!date) {
    return NULL;
  }
  memcpy(date, src, sizeof(mg_date));
  return date;
}